

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_b0fde8::getInputPath(string *arg,cmExecutionStatus *status,string *path)

{
  bool bVar1;
  cmMakefile *this;
  string *psVar2;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue def;
  string *path_local;
  cmExecutionStatus *status_local;
  string *arg_local;
  
  def.Value = path;
  this = cmExecutionStatus::GetMakefile(status);
  local_30 = cmMakefile::GetDefinition(this,arg);
  bVar1 = cmValue::operator_cast_to_bool(&local_30);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_30);
    std::__cxx11::string::operator=((string *)def.Value,(string *)psVar2);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"undefined variable for input path.",&local_51);
    cmExecutionStatus::SetError(status,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return bVar1;
}

Assistant:

bool getInputPath(const std::string& arg, cmExecutionStatus& status,
                  std::string& path)
{
  cmValue def = status.GetMakefile().GetDefinition(arg);
  if (!def) {
    status.SetError("undefined variable for input path.");
    return false;
  }

  path = *def;
  return true;
}